

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQInteger __thiscall SQCompiler::ChooseCompArithCharByToken(SQCompiler *this,SQInteger tok)

{
  SQInteger local_20;
  SQInteger oper;
  SQInteger tok_local;
  SQCompiler *this_local;
  
  switch(tok) {
  case 0x121:
    local_20 = 0x2b;
    break;
  case 0x122:
    local_20 = 0x2d;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqcompiler.cpp"
                  ,0x24e,"SQInteger SQCompiler::ChooseCompArithCharByToken(SQInteger)");
  case 0x13d:
    local_20 = 0x2a;
    break;
  case 0x13e:
    local_20 = 0x2f;
    break;
  case 0x13f:
    local_20 = 0x25;
  }
  return local_20;
}

Assistant:

SQInteger ChooseCompArithCharByToken(SQInteger tok)
    {
        SQInteger oper;
        switch(tok){
        case TK_MINUSEQ: oper = '-'; break;
        case TK_PLUSEQ: oper = '+'; break;
        case TK_MULEQ: oper = '*'; break;
        case TK_DIVEQ: oper = '/'; break;
        case TK_MODEQ: oper = '%'; break;
        default: oper = 0; //shut up compiler
            assert(0); break;
        };
        return oper;
    }